

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
* testing::internal::
  ActionResultHolder<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
  ::
  PerformAction<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>)>
            (Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
             *action,ArgumentTuple *args)

{
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> _Var1;
  ActionResultHolder<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  *pAVar2;
  pointer *__ptr;
  undefined8 local_20;
  
  pAVar2 = (ActionResultHolder<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
            *)operator_new(0x10);
  _Var1._M_head_impl =
       *(Snapshot **)
        &(args->
         super__Tuple_impl<0UL,_std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
         ).
         super__Head_base<0UL,_std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
         ._M_t.
         super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ;
  (args->
  super__Tuple_impl<0UL,_std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ).
  super__Head_base<0UL,_std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
       = (_Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          )0x0;
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::Perform((Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
             *)&stack0xffffffffffffffe0,(ArgumentTuple *)action);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00321748;
  (pAVar2->result_).value_._M_t.
  super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
       (Snapshot *)local_20;
  local_20 = (void *)0x0;
  if ((_Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>)_Var1._M_head_impl !=
      (_Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>)0x0) {
    (*(_Var1._M_head_impl)->_vptr_Snapshot[1])();
  }
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }